

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O1

bool __thiscall nuraft::FakeNetwork::execReqResp(FakeNetwork *this,string *endpoint)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
  clients_clone;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
  local_60;
  
  if (endpoint->_M_string_length == 0) {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    __mutex = &this->clientsLock;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
    ::operator=(&local_60,&(this->clients)._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      delieverReqTo(this,(string *)(p_Var5 + 1),false);
    }
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
    ::operator=(&local_60,&(this->clients)._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      handleRespFrom(this,(string *)(p_Var5 + 1),false);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
    ::~_Rb_tree(&local_60);
    bVar3 = true;
  }
  else {
    bVar3 = false;
    bVar2 = delieverReqTo(this,endpoint,false);
    if (bVar2) {
      bVar3 = handleRespFrom(this,endpoint,false);
      return bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool FakeNetwork::execReqResp(const std::string& endpoint) {
    if (endpoint.empty()) {
        // Do the same thing to all.

        std::map< std::string, ptr<FakeClient> > clients_clone;

        // WARNING:
        //   As a result of processing req or resp, client re-connection
        //   may happen and previous connection will be removed. To avoid
        //   `FakeClient` is being removed in the middle of processing,
        //   we should maintain the copy of the list to keep their
        //   reference counter greater than 0.
        {   std::lock_guard<std::mutex> ll(clientsLock);
            clients_clone = clients;
        }
        for (auto& entry: clients_clone) {
            const std::string& cur_endpoint = entry.first;
            bool ret = delieverReqTo(cur_endpoint);
            if (!ret) continue;
        }

        // Same as above.
        {   std::lock_guard<std::mutex> ll(clientsLock);
            clients_clone = clients;
        }
        for (auto& entry: clients_clone) {
            const std::string& cur_endpoint = entry.first;
            bool ret = handleRespFrom(cur_endpoint);
            if (!ret) continue;
        }
        return true;
    }

    bool ret = delieverReqTo(endpoint);
    if (!ret) return ret;

    ret = handleRespFrom(endpoint);
    return ret;
}